

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_lb.c
# Opt level: O0

void gga_lb_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_x_lb_params *params;
  
  pvVar2 = malloc(0x18);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0xa0) {
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0x3fa999999999999a;
    puVar1[2] = 0x3ff0000000000000;
  }
  else if (*(int *)*in_RDI == 0xb6) {
    *puVar1 = 0x3ff30a3d70a3d70a;
    puVar1[1] = 0x3f847ae147ae147b;
    puVar1[2] = 0x3ff0000000000000;
  }
  return;
}

Assistant:

static void
gga_lb_init(xc_func_type *p)
{
  gga_x_lb_params *params;

  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_lb_params));
  params = (gga_x_lb_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_LB:
    params->alpha = 1.0;
    params->beta  = 0.05;
    params->gamma = 1.0;
    break;
  case XC_GGA_X_LBM:
    params->alpha = 1.19;
    params->beta  = 0.01;
    params->gamma = 1.0;
    break;
  }
}